

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# markdownhighlighter.cpp
# Opt level: O2

void __thiscall
MarkdownHighlighter::clearRangesForBlock(MarkdownHighlighter *this,int blockNumber,RangeType type)

{
  int iVar1;
  undefined4 uVar2;
  QList<MarkdownHighlighter::InlineRange> *this_00;
  iterator iVar3;
  iterator iVar4;
  long lVar5;
  long lVar6;
  InlineRange *pIVar7;
  InlineRange *pIVar8;
  int blockNumber_local;
  QArrayDataPointer<MarkdownHighlighter::InlineRange> local_68;
  QArrayDataPointer<MarkdownHighlighter::InlineRange> local_48;
  
  local_68.d = (Data *)0x0;
  local_68.ptr = (InlineRange *)0x0;
  local_68.size = 0;
  blockNumber_local = blockNumber;
  QHash<int,_QList<MarkdownHighlighter::InlineRange>_>::value
            ((QList<MarkdownHighlighter::InlineRange> *)&local_48,&this->_ranges,&blockNumber_local,
             (QList<MarkdownHighlighter::InlineRange> *)&local_68);
  QArrayDataPointer<MarkdownHighlighter::InlineRange>::~QArrayDataPointer(&local_48);
  QArrayDataPointer<MarkdownHighlighter::InlineRange>::~QArrayDataPointer(&local_68);
  if (local_48.size == 0) {
    return;
  }
  QSyntaxHighlighter::currentBlock();
  uVar2 = QTextBlock::blockNumber();
  local_68.d = (Data *)CONCAT44(local_68.d._4_4_,uVar2);
  this_00 = QHash<int,_QList<MarkdownHighlighter::InlineRange>_>::operator[]
                      (&this->_ranges,(int *)&local_68);
  iVar3 = QList<MarkdownHighlighter::InlineRange>::begin(this_00);
  iVar4 = QList<MarkdownHighlighter::InlineRange>::end(this_00);
  lVar6 = (long)iVar4.i - (long)iVar3.i;
  pIVar8 = iVar3.i + 2;
  for (lVar5 = lVar6 / 0xc >> 2; 0 < lVar5; lVar5 = lVar5 + -1) {
    if (pIVar8[-2].type == type) {
      iVar3.i = pIVar8 + -2;
      goto LAB_00122960;
    }
    if (pIVar8[-1].type == type) {
      iVar3.i = pIVar8 + -1;
      goto LAB_00122960;
    }
    iVar3.i = pIVar8;
    if (pIVar8->type == type) goto LAB_00122960;
    if (pIVar8[1].type == type) {
      iVar3.i = pIVar8 + 1;
      goto LAB_00122960;
    }
    pIVar8 = pIVar8 + 4;
    lVar6 = lVar6 + -0x30;
  }
  lVar6 = lVar6 / 0xc;
  pIVar7 = pIVar8 + -2;
  if (lVar6 == 1) {
LAB_001229d2:
    iVar3.i = pIVar7;
    if (pIVar7->type != type) {
      iVar3 = iVar4;
    }
  }
  else if (lVar6 == 3) {
    iVar3.i = pIVar7;
    if (pIVar8[-2].type != type) {
      pIVar7 = pIVar8 + -1;
      goto LAB_001229c9;
    }
  }
  else {
    iVar3 = iVar4;
    if (lVar6 != 2) goto LAB_00122996;
LAB_001229c9:
    iVar3.i = pIVar7;
    if (pIVar7->type != type) {
      pIVar7 = pIVar7 + 1;
      goto LAB_001229d2;
    }
  }
LAB_00122960:
  pIVar8 = iVar3.i;
  if (iVar3.i != iVar4.i) {
    while (pIVar7 = pIVar8, pIVar8 = pIVar7 + 1, pIVar8 != iVar4.i) {
      if (pIVar7[1].type != type) {
        (iVar3.i)->type = pIVar7[1].type;
        iVar1 = pIVar8->end;
        (iVar3.i)->begin = pIVar8->begin;
        (iVar3.i)->end = iVar1;
        iVar3.i = iVar3.i + 1;
      }
    }
  }
LAB_00122996:
  iVar4 = QList<MarkdownHighlighter::InlineRange>::end(this_00);
  QList<MarkdownHighlighter::InlineRange>::erase
            (this_00,(const_iterator)iVar3.i,(const_iterator)iVar4.i);
  return;
}

Assistant:

void MarkdownHighlighter::clearRangesForBlock(int blockNumber, RangeType type)
{
    if (!_ranges.value(blockNumber).isEmpty()) {
        auto& rangeList = _ranges[currentBlock().blockNumber()];
        rangeList.erase(std::remove_if(rangeList.begin(), rangeList.end(),
                                       [type](const InlineRange& range) {
           return range.type == type;
        }), rangeList.end());
    }
}